

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_4ffb8::SequenceExpr::parse_non_term(SequenceExpr *this,Context *con)

{
  element_type *peVar1;
  int iVar2;
  
  iVar2 = (*((this->super_BinaryExpr).left.super_shared_ptr<pegmatite::Expr>.
             super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Expr[2])
                    ();
  if ((char)iVar2 != '\0') {
    pegmatite::Context::parse_ws(con);
    peVar1 = (this->super_BinaryExpr).right.super_shared_ptr<pegmatite::Expr>.
             super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar2 = (*peVar1->_vptr_Expr[2])(peVar1,con);
    return SUB41(iVar2,0);
  }
  return false;
}

Assistant:

virtual bool parse_non_term(Context &con) const
	{
		if (!left->parse_non_term(con)) return false;
		con.parse_ws();
		return right->parse_non_term(con);
	}